

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
::clear(flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
        *this)

{
  buffer_t<char> *this_00;
  char *buffer;
  size_type buffer_size;
  
  this_00 = &(this->buffer_).v2_;
  buffer_t<char>::validate(this_00);
  buffer = (this->buffer_).v2_.begin;
  if (buffer != (char *)0x0) {
    buffer_size = total_capacity(this);
    deallocate_buffer(this,buffer,buffer_size);
    this_00->begin = (pointer_type)0x0;
    (this->buffer_).v2_.last = (pointer_type)0x0;
    (this->buffer_).v2_.end = (pointer_type)0x0;
  }
  buffer_t<char>::validate(this_00);
  return;
}

Assistant:

void clear() noexcept {
        validate_pointer_invariants();
        if (buff().begin) {
            deallocate_buffer(buff().begin, total_capacity());
            buff().clear();
        }
        validate_pointer_invariants();
    }